

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

uint32 __thiscall google::protobuf::MapValueRef::GetUInt32Value(MapValueRef *this)

{
  CppType CVar1;
  LogMessage *other;
  undefined8 *in_RDI;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff70;
  MapValueRef *in_stack_ffffffffffffffc0;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  CVar1 = type(in_stack_ffffffffffffffc0);
  if (CVar1 != CPPTYPE_UINT32) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff70,level,
               (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    FieldDescriptor::CppTypeName(CPPTYPE_UINT32);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    internal::LogMessage::operator<<
              ((LogMessage *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    CVar1 = type(in_stack_ffffffffffffffc0);
    FieldDescriptor::CppTypeName(CVar1);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)CONCAT44(CVar1,in_stack_ffffffffffffff60),
                       in_stack_ffffffffffffff58);
    internal::LogFinisher::operator=((LogFinisher *)CONCAT44(CVar1,in_stack_ffffffffffffff60),other)
    ;
    internal::LogMessage::~LogMessage((LogMessage *)0x43476e);
  }
  return *(uint32 *)*in_RDI;
}

Assistant:

uint32 GetUInt32Value() const {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_UINT32, "MapValueRef::GetUInt32Value");
    return *reinterpret_cast<uint32*>(data_);
  }